

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

void IncrementSessionCounter(void)

{
  Locker locker;
  OutputWorker *in_stack_00000030;
  Lock *in_stack_ffffffffffffffd8;
  Locker *in_stack_ffffffffffffffe0;
  
  tonk::Locker::Locker(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (m_SessionCounter == 0) {
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Start(in_stack_00000030);
    StartWLANOptimizerThread();
    tonk::Firewall_Initialize();
  }
  m_SessionCounter = m_SessionCounter + 1;
  tonk::Locker::~Locker((Locker *)0x12b92f);
  return;
}

Assistant:

static void IncrementSessionCounter()
{
    Locker locker(m_SessionCounterLock);

    // If first session started:
    if (m_SessionCounter == 0)
    {
        // Start background utility threads:

        // Must be first
        logger::Start();

        StartWLANOptimizerThread();
        Firewall_Initialize();
    }

    ++m_SessionCounter;
}